

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_remove_table(nk_window *win,nk_table *tbl)

{
  nk_table *pnVar1;
  nk_table *pnVar2;
  
  pnVar1 = tbl->next;
  if (win->tables == tbl) {
    win->tables = pnVar1;
  }
  pnVar2 = tbl->prev;
  if (pnVar1 != (nk_table *)0x0) {
    pnVar1->prev = pnVar2;
  }
  if (pnVar2 != (nk_table *)0x0) {
    pnVar2->next = pnVar1;
  }
  tbl->next = (nk_table *)0x0;
  tbl->prev = (nk_table *)0x0;
  return;
}

Assistant:

NK_LIB void
nk_remove_table(struct nk_window *win, struct nk_table *tbl)
{
if (win->tables == tbl)
win->tables = tbl->next;
if (tbl->next)
tbl->next->prev = tbl->prev;
if (tbl->prev)
tbl->prev->next = tbl->next;
tbl->next = 0;
tbl->prev = 0;
}